

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O1

void __thiscall
CNscContext::AddStructure
          (CNscContext *this,char *pszIdentifier,uchar *pauchStructData,size_t nStructDataSize)

{
  size_t *psVar1;
  long *plVar2;
  uint uVar3;
  size_t sVar4;
  uchar *puVar5;
  size_t sVar6;
  iterator __position;
  CNscSymbolTable *this_00;
  int iVar7;
  NscSymbol *pNVar8;
  int iVar9;
  NscPCodeHeader *p;
  long *plVar10;
  int iVar11;
  size_t nSymbol;
  unsigned_long local_48;
  long *local_40;
  CNscSymbolTable *local_38;
  
  uVar3 = this->m_nStructs;
  if (0x7f < (int)uVar3) {
    GenerateMessage(this,NscMessage_ErrorTooManyStructures,(ulong)uVar3);
    return;
  }
  local_38 = &this->m_sSymbols;
  local_40 = (long *)pauchStructData;
  pNVar8 = CNscSymbolTable::Add(local_38,pszIdentifier,NscSymType_Structure);
  (pNVar8->field_6).field_0.nToken = uVar3 + 0x20;
  iVar9 = 0;
  (pNVar8->field_6).field_0.nEngineObject = 0;
  (pNVar8->field_6).field_2.nStackOffset = 0;
  local_48 = (long)pNVar8 - (long)(this->m_sSymbols).m_pauchData;
  iVar11 = 0;
  if (0 < (long)nStructDataSize) {
    plVar2 = (long *)((long)local_40 + nStructDataSize);
    iVar11 = 0;
    iVar9 = 0;
    plVar10 = local_40;
    do {
      iVar11 = iVar11 + 1;
      iVar7 = GetTypeSize(this,*(NscType *)((long)plVar10 + 0xc));
      iVar9 = iVar9 + iVar7;
      plVar10 = (long *)((long)plVar10 + *plVar10);
    } while (plVar10 < plVar2);
  }
  this_00 = local_38;
  sVar4 = (this->m_sSymbols).m_nSize;
  CNscSymbolTable::MakeRoom(local_38,8);
  puVar5 = (this->m_sSymbols).m_pauchData;
  sVar6 = (this->m_sSymbols).m_nSize;
  *(int *)(puVar5 + sVar6) = iVar11;
  *(int *)(puVar5 + sVar6 + 4) = iVar9;
  psVar1 = &(this->m_sSymbols).m_nSize;
  *psVar1 = *psVar1 + 8;
  CNscSymbolTable::MakeRoom(this_00,nStructDataSize);
  memcpy((this->m_sSymbols).m_pauchData + (this->m_sSymbols).m_nSize,local_40,nStructDataSize);
  psVar1 = &(this->m_sSymbols).m_nSize;
  *psVar1 = *psVar1 + nStructDataSize;
  puVar5 = (this->m_sSymbols).m_pauchData;
  pNVar8 = (NscSymbol *)(puVar5 + local_48);
  *(size_t *)(puVar5 + local_48 + 0x28) = sVar4;
  iVar9 = -2;
  if ((this->m_fCompilingIntrinsic == false) && (iVar9 = -1, this->m_fNWScript == false)) {
    iVar9 = this->m_pStreamTop->nFile;
  }
  pNVar8->nFile = iVar9;
  pNVar8->nLine = this->m_pStreamTop->nLine;
  iVar9 = this->m_nStructs;
  this->m_nStructs = iVar9 + 1;
  this->m_anStructSymbol[iVar9] = local_48;
  __position._M_current =
       (this->m_anGlobalDefs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_anGlobalDefs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->m_anGlobalDefs,
               __position,&local_48);
  }
  else {
    *__position._M_current = local_48;
    (this->m_anGlobalDefs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  MarkGlobalIdentifierSymbol(this,pNVar8);
  return;
}

Assistant:

void CNscContext::AddStructure (const char *pszIdentifier, 
	unsigned char *pauchStructData, size_t nStructDataSize)
{

	//
	// Make sure we still have room
	//

	if (m_nStructs >= Max_Structs)
	{
		GenerateMessage (NscMessage_ErrorTooManyStructures, m_nStructs);
		return;
	}

	//
	// Add a new symbol
	//

	NscType nType = (NscType) (NscType_Struct_0 + m_nStructs);
	NscSymbol *pSymbol = m_sSymbols .Add (
		pszIdentifier, NscSymType_Structure);
	pSymbol ->nType = nType;
	pSymbol ->ulFlags = 0;
	pSymbol ->nStackOffset = 0;
	size_t nSymbol = m_sSymbols .GetSymbolOffset (pSymbol);

	//
	// Count the number of elements
	//

	NscSymbolStructExtra sExtra;
	sExtra .nElementCount = 0;
	sExtra .nTotalSize = 0;
	unsigned char *pauchData = pauchStructData;
	unsigned char *pauchEnd = &pauchData [nStructDataSize];
	while (pauchData < pauchEnd)
	{
		NscPCodeHeader *p = (NscPCodeHeader *) pauchData;
		sExtra .nElementCount++;
		sExtra .nTotalSize += GetTypeSize (p ->nType);
		pauchData += p ->nOpSize;
	}

	//
	// Add the symbol data
	//

	size_t nExtra = m_sSymbols .AppendData (&sExtra, sizeof (sExtra));
	m_sSymbols .AppendData (pauchStructData, nStructDataSize);

	//
	// Save the data
	//

	pSymbol = m_sSymbols .GetSymbol (nSymbol);
	pSymbol ->nExtra = nExtra;
	pSymbol ->nFile = GetCurrentSourceFile ();
	pSymbol ->nLine = GetCurrentLine ();

	//
	// Save the symbol offset
	//

	m_anStructSymbol [m_nStructs++] = nSymbol;
	m_anGlobalDefs .push_back (nSymbol);
	MarkGlobalIdentifierSymbol (pSymbol);
}